

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O0

ostream * setup::operator<<(ostream *os,windows_version *version)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ostream *poVar4;
  long in_RSI;
  data *in_RDI;
  char *nt_name;
  char *win_name;
  data *in_stack_ffffffffffffffd8;
  data *in_stack_ffffffffffffffe0;
  
  operator<<((ostream *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = windows_version::data::operator!=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::operator<<((ostream *)in_RDI,"  nt ");
    operator<<((ostream *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  pcVar2 = anon_unknown_2::get_version_name(in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  pcVar3 = anon_unknown_2::get_version_name(in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  if ((pcVar2 != (char *)0x0) || (pcVar3 != (char *)0x0)) {
    std::operator<<((ostream *)in_RDI," (");
    if (pcVar2 != (char *)0x0) {
      std::operator<<((ostream *)in_RDI,pcVar2);
    }
    if ((pcVar3 != (char *)0x0) && (pcVar3 != pcVar2)) {
      if (pcVar2 != (char *)0x0) {
        std::operator<<((ostream *)in_RDI," / ");
      }
      std::operator<<((ostream *)in_RDI,pcVar3);
    }
    std::operator<<((ostream *)in_RDI,')');
  }
  if ((*(int *)(in_RSI + 0x18) != 0) || (*(int *)(in_RSI + 0x1c) != 0)) {
    poVar4 = std::operator<<((ostream *)in_RDI," service pack ");
    std::ostream::operator<<(poVar4,*(uint *)(in_RSI + 0x18));
    if (*(int *)(in_RSI + 0x1c) != 0) {
      poVar4 = std::operator<<((ostream *)in_RDI,'.');
      std::ostream::operator<<(poVar4,*(uint *)(in_RSI + 0x1c));
    }
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const windows_version & version) {
	
	os << version.win_version;
	if(version.nt_version != version.win_version) {
		os << "  nt " << version.nt_version;
	}
	
	const char * win_name = get_version_name(version.win_version);
	const char * nt_name = get_version_name(version.nt_version, true);
	
	if(win_name || nt_name) {
		os << " (";
		if(win_name) {
			os << win_name;
		}
		if(nt_name && nt_name != win_name) {
			if(win_name) {
				os << " / ";
			}
			os << nt_name;
		}
		os << ')';
	}
	
	if(version.nt_service_pack.major || version.nt_service_pack.minor) {
		os << " service pack " << version.nt_service_pack.major;
		if(version.nt_service_pack.minor) {
			os << '.' << version.nt_service_pack.minor;
		}
	}
	
	return os;
}